

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::TestTestRunnerFixtureReporterNotifiedOfFailedTests::RunImpl
          (TestTestRunnerFixtureReporterNotifiedOfFailedTests *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_878 [8];
  TestRunnerFixtureReporterNotifiedOfFailedTestsHelper fixtureHelper;
  bool ctorOk;
  TestTestRunnerFixtureReporterNotifiedOfFailedTests *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  TestRunnerFixtureReporterNotifiedOfFailedTestsHelper::
  TestRunnerFixtureReporterNotifiedOfFailedTestsHelper
            ((TestRunnerFixtureReporterNotifiedOfFailedTestsHelper *)local_878,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<(anonymous_namespace)::TestRunnerFixtureReporterNotifiedOfFailedTestsHelper>
            ((TestRunnerFixtureReporterNotifiedOfFailedTestsHelper *)local_878,
             &(this->super_Test).m_details);
  TestRunnerFixtureReporterNotifiedOfFailedTestsHelper::
  ~TestRunnerFixtureReporterNotifiedOfFailedTestsHelper
            ((TestRunnerFixtureReporterNotifiedOfFailedTestsHelper *)local_878);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, ReporterNotifiedOfFailedTests)
{
    MockTest test1("test", false, false, 2);
    MockTest test2("test", true, false);
    MockTest test3("test", false, false, 3);
    list.Add(&test1);
    list.Add(&test2);
    list.Add(&test3);

	runner.RunTestsIf(list, NULL, True(), 0);
    CHECK_EQUAL(2, reporter.summaryFailedTestCount);
}